

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingOpenCV.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  ImageFormat format;
  Result *pRVar5;
  Barcodes barcodes;
  Mat image;
  VideoCapture cap;
  ImageView local_1e8;
  _InputArray local_1c8;
  undefined1 local_1b0 [24];
  uint8_t **local_198;
  int local_190;
  int local_18c;
  uint8_t *local_188 [10];
  VideoCapture local_138 [48];
  Result local_108;
  
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Display window","");
  cv::namedWindow((string *)&local_198,1);
  if (local_198 != local_188) {
    operator_delete(local_198,(ulong)(local_188[0] + 1));
  }
  cv::Mat::Mat((Mat *)&local_198);
  cv::VideoCapture::VideoCapture(local_138,0,0);
  cVar3 = cv::VideoCapture::isOpened();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cannot open camera",0x12);
  }
  else {
    while( true ) {
      iVar4 = cv::waitKey(0x19);
      if (iVar4 == 0x1b) break;
      cv::VideoCapture::operator>>(local_138,(Mat *)&local_198);
      local_1c8.flags = local_1c8.flags & 0xc0e08000U | 0x80d2f;
      local_1c8._4_4_ = 0x1f4ff02;
      local_1c8.obj._0_4_ = 0;
      switch((uint)local_198 >> 3 & 0x1ff) {
      case 0:
        format = Lum;
        break;
      case 1:
        format = LumA;
        break;
      case 2:
        format = BGR;
        break;
      case 3:
        format = BGRA;
        break;
      default:
        format = None;
        bVar1 = true;
        goto LAB_0010250c;
      }
      bVar1 = false;
LAB_0010250c:
      if ((((ulong)local_198 & 7) != 0) || (bVar1)) {
        main_cold_1();
      }
      else {
        ZXing::ImageView::ImageView(&local_1e8,local_188[0],local_18c,local_190,format,0,0);
      }
      ZXing::ReadBarcodes((ImageView *)local_1b0,(ReaderOptions *)&local_1e8);
      uVar2 = local_1b0._8_8_;
      for (pRVar5 = (Result *)local_1b0._0_8_; pRVar5 != (Result *)uVar2; pRVar5 = pRVar5 + 1) {
        ZXing::Result::Result(&local_108,pRVar5);
        DrawBarcode((Mat *)&local_198,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._sai.id._M_dataplus._M_p != &local_108._sai.id.field_2) {
          operator_delete(local_108._sai.id._M_dataplus._M_p,
                          local_108._sai.id.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._error._msg._M_dataplus._M_p != &local_108._error._msg.field_2) {
          operator_delete(local_108._error._msg._M_dataplus._M_p,
                          local_108._error._msg.field_2._M_allocated_capacity + 1);
        }
        if (local_108._content.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108._content.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_108._content.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108._content.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_108._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108._content.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108._content.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108._content.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      local_1e8._data = (uint8_t *)&local_1e8._height;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Display window","");
      local_1c8.sz.width = 0;
      local_1c8.sz.height = 0;
      local_1c8.flags = 0x1010000;
      local_1c8.obj = (Mat *)&local_198;
      cv::imshow((string *)&local_1e8,&local_1c8);
      if ((int *)local_1e8._data != &local_1e8._height) {
        operator_delete(local_1e8._data,local_1e8._16_8_ + 1);
      }
      std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_1b0);
    }
  }
  cv::VideoCapture::~VideoCapture(local_138);
  cv::Mat::~Mat((Mat *)&local_198);
  return 0;
}

Assistant:

int main()
{
	namedWindow("Display window");

	Mat image;
	VideoCapture cap(0);

	if (!cap.isOpened())
		std::cout << "cannot open camera";
	else
		while (waitKey(25) != 27) {
			cap >> image;
			auto barcodes = ReadBarcodes(image);
			for (auto& barcode : barcodes)
				DrawBarcode(image, barcode);
			imshow("Display window", image);
		}

	return 0;
}